

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Abs_RpmPerformMark(Gia_Man_t *p,int nCutMax,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint nSize0;
  uint uVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *vAnds;
  Vec_Int_t *vSupp;
  Vec_Int_t *__ptr;
  word *pTruth;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  uint local_7c;
  
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark1(p);
  pVVar7 = p->vCis;
  uVar9 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if ((int)uVar9 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar7->pArray[lVar6];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00620a55:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar4;
      *(ulong *)pGVar1 = *(ulong *)pGVar1 | 0x4000000000000000;
      lVar6 = lVar6 + 1;
      pVVar7 = p->vCis;
      uVar9 = (ulong)pVVar7->nSize;
    } while (lVar6 < (long)(uVar9 - (long)p->nRegs));
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  vAnds = (Vec_Int_t *)malloc(0x10);
  vAnds->nCap = 100;
  vAnds->nSize = 0;
  piVar8 = (int *)malloc(400);
  vAnds->pArray = piVar8;
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar8 = (int *)malloc(400);
  vSupp->pArray = piVar8;
  local_7c = 0;
  uVar10 = local_7c;
  do {
    local_7c = uVar10;
    Gia_ManComputeDoms(p);
    __ptr = Gia_ManCollectDoms(p);
    if (fVerbose == 0 && fVeryVerbose == 0) {
      uVar10 = __ptr->nSize;
    }
    else {
      Gia_ManCountPisNodes(p,pVVar7,vAnds);
      printf("Iter %3d :  ",(ulong)local_7c);
      printf("PI = %5d  (%6.2f %%)  ",
             ((double)pVVar7->nSize * 100.0) / (double)(p->vCis->nSize - p->nRegs));
      printf("And = %6d  (%6.2f %%) ",
             ((double)vAnds->nSize * 100.0) /
             (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
      uVar10 = __ptr->nSize;
      printf("Dom = %5d  (%6.2f %%)  ",
             ((double)(int)uVar10 * 100.0) / (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs)
             ,(ulong)uVar10);
      putchar(10);
    }
    piVar8 = __ptr->pArray;
    if ((int)uVar10 < 1) {
      bVar2 = true;
      if (piVar8 == (int *)0x0) {
        free(__ptr);
        break;
      }
    }
    else {
      uVar9 = 0;
      bVar2 = false;
      do {
        lVar6 = (long)piVar8[uVar9];
        if ((lVar6 < 0) || (p->nObjs <= piVar8[uVar9])) goto LAB_00620a55;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + lVar6;
        if (((undefined1  [12])*pGVar1 & (undefined1  [12])0x4000000000000000) !=
            (undefined1  [12])0x0) {
          __assert_fail("!pObj->fMark1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                        ,0x2c9,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
        }
        if (p->pRefs[lVar6] < 1) {
          __assert_fail("Gia_ObjRefNum( p, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                        ,0x2ca,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
        }
        uVar3 = Abs_GiaObjDeref_rec(p,pGVar1);
        iVar4 = Abs_ManSupport2(p,pGVar1,vSupp);
        if (nCutMax < iVar4) {
          Abs_GiaObjRef_rec(p,pGVar1);
        }
        else {
          nSize0 = Abs_GiaSortNodes(p,vSupp);
          if (((int)nSize0 < 1) || (nCutMax < (int)nSize0)) {
            __assert_fail("nSize0 > 0 && nSize0 <= nCutMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                          ,0x2eb,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
          }
          pTruth = Gia_ObjComputeTruthTableCut(p,pGVar1,vSupp);
          if (pTruth != (word *)0x0) {
            uVar5 = Abs_GiaCheckTruth(pTruth,vSupp->nSize,nSize0);
            if (fVeryVerbose != 0) {
              printf("Nodes =%3d ",(ulong)uVar3);
              printf("Size =%3d ",(ulong)(uint)vSupp->nSize);
              printf("Size0 =%3d  ",(ulong)nSize0);
              pcVar11 = "no";
              if (uVar5 == 0) {
                pcVar11 = "yes";
              }
              printf("%3s",pcVar11);
              Abs_GiaCofPrint(pTruth,vSupp->nSize,nSize0,uVar5 ^ 1);
            }
            if (uVar5 != 0) {
              *(ulong *)pGVar1 = *(ulong *)pGVar1 | 0x4000000000000000;
              bVar2 = true;
              goto LAB_006208d6;
            }
          }
          Abs_GiaObjRef_rec(p,pGVar1);
        }
LAB_006208d6:
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      bVar2 = !bVar2;
    }
    free(piVar8);
    free(__ptr);
    uVar10 = local_7c + 1;
  } while (!bVar2);
  local_7c = local_7c + 1;
  if (fVeryVerbose != 0) {
    Gia_ManCountPisNodes(p,pVVar7,vAnds);
    printf("Iter %3d :  ",(ulong)local_7c);
    printf("PI = %5d  (%6.2f %%)  ",
           ((double)pVVar7->nSize * 100.0) / (double)(p->vCis->nSize - p->nRegs));
    printf("And = %6d  (%6.2f %%) ",
           ((double)vAnds->nSize * 100.0) / (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs))
    ;
    putchar(10);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (vAnds->pArray != (int *)0x0) {
    free(vAnds->pArray);
  }
  free(vAnds);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
  }
  free(vSupp);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Abs_RpmPerformMark( Gia_Man_t * p, int nCutMax, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vPis, * vAnds, * vDoms;
    Vec_Int_t * vSupp, * vSupp1, * vSupp2;
    Gia_Obj_t * pObj;
    word * pTruth;
    int Iter, i, nSize0, nNodes;
    int fHasConst, fChanges = 1;
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vPis = Vec_IntAlloc( 100 );
    vAnds = Vec_IntAlloc( 100 );
    vSupp1 = Vec_IntAlloc( 100 );
    vSupp2 = Vec_IntAlloc( 100 );
    for ( Iter = 0; fChanges; Iter++ )
    {
        fChanges = 0;
        vDoms = Gia_ManComputePiDoms( p );
        // count the number of PIs and internal nodes
        if ( fVerbose || fVeryVerbose )
        {
            Gia_ManCountPisNodes( p, vPis, vAnds );
            printf( "Iter %3d :  ", Iter );
            printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
            printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
            printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
            printf( "\n" );
        }
//        pObj = Gia_ObjFanin0( Gia_ManPo(p, 1) );
        Gia_ManForEachObjVec( vDoms, p, pObj, i )
        {
            assert( !pObj->fMark1 );
            assert( Gia_ObjRefNum( p, pObj ) > 0 );
            // dereference root node
            nNodes = Abs_GiaObjDeref_rec( p, pObj );
/*
            // compute support of full cone
            if ( Abs_ManSupport1(p, pObj, vSupp1) > nCutMax )
//            if ( 1 )
            {
                // check support of MFFC
                if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
//                if ( 1 )
                {
                    Abs_GiaObjRef_rec( p, pObj );
                    continue;
                }
                vSupp = vSupp2;
//                printf( "-" );
            }
            else
            {
                vSupp = vSupp1;
//                printf( "+" );
            }
*/
            if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            vSupp = vSupp2;

            // order nodes by their ref counts
            nSize0 = Abs_GiaSortNodes( p, vSupp );
            assert( nSize0 > 0 && nSize0 <= nCutMax );
            // check if truth table has const cofs
            pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vSupp );
            if ( pTruth == NULL )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            fHasConst = !Abs_GiaCheckTruth( pTruth, Vec_IntSize(vSupp), nSize0 );
            if ( fVeryVerbose )
            {
                printf( "Nodes =%3d ",  nNodes );
                printf( "Size =%3d ",   Vec_IntSize(vSupp) );
                printf( "Size0 =%3d  ", nSize0 );
                printf( "%3s", fHasConst ? "yes" : "no" );
                Abs_GiaCofPrint( pTruth, Vec_IntSize(vSupp), nSize0, fHasConst );
            }
            if ( fHasConst )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            // pObj can be reparamed
            pObj->fMark1 = 1;
            fChanges = 1;
        }
        Vec_IntFree( vDoms );
    }
    // count the number of PIs and internal nodes
    if ( fVeryVerbose )
    {
        Gia_ManCountPisNodes( p, vPis, vAnds );
        printf( "Iter %3d :  ", Iter );
        printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
        printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
//        printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
        printf( "\n" );
    }
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
//    Gia_ManCleanMark1( p ); // this will erase markings
    ABC_FREE( p->pRefs );
}